

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.h
# Opt level: O1

string_view __thiscall absl::StripAsciiWhitespace(absl *this,string_view str)

{
  byte *pbVar1;
  ulong uVar2;
  long lVar3;
  absl *paVar4;
  byte *pbVar5;
  absl *paVar6;
  byte *pbVar7;
  ulong uVar8;
  string_view sVar9;
  
  pbVar5 = (byte *)str._M_len;
  pbVar1 = pbVar5;
  if (0 < (long)this >> 2) {
    pbVar1 = pbVar5 + ((ulong)this & 0xfffffffffffffffc);
    lVar3 = ((long)this >> 2) + 1;
    pbVar7 = pbVar5 + 3;
    do {
      if (((&ascii_internal::kPropertyBits)[pbVar7[-3]] & 8) == 0) {
        pbVar7 = pbVar7 + -3;
        goto LAB_00272134;
      }
      if (((&ascii_internal::kPropertyBits)[pbVar7[-2]] & 8) == 0) {
        pbVar7 = pbVar7 + -2;
        goto LAB_00272134;
      }
      if (((&ascii_internal::kPropertyBits)[pbVar7[-1]] & 8) == 0) {
        pbVar7 = pbVar7 + -1;
        goto LAB_00272134;
      }
      if (((&ascii_internal::kPropertyBits)[*pbVar7] & 8) == 0) goto LAB_00272134;
      lVar3 = lVar3 + -1;
      pbVar7 = pbVar7 + 4;
    } while (1 < lVar3);
  }
  lVar3 = (long)(pbVar5 + (long)this) - (long)pbVar1;
  if (lVar3 == 1) {
LAB_0027211d:
    pbVar7 = pbVar1;
    if (((&ascii_internal::kPropertyBits)[*pbVar1] & 8) != 0) {
LAB_00272131:
      pbVar7 = pbVar5 + (long)this;
    }
  }
  else if (lVar3 == 2) {
LAB_002720f3:
    pbVar7 = pbVar1;
    if (((&ascii_internal::kPropertyBits)[*pbVar1] & 8) != 0) {
      pbVar1 = pbVar1 + 1;
      goto LAB_0027211d;
    }
  }
  else {
    if (lVar3 != 3) goto LAB_00272131;
    pbVar7 = pbVar1;
    if (((&ascii_internal::kPropertyBits)[*pbVar1] & 8) != 0) {
      pbVar1 = pbVar1 + 1;
      goto LAB_002720f3;
    }
  }
LAB_00272134:
  paVar4 = (absl *)(pbVar7 + -(long)pbVar5);
  uVar8 = (long)this - (long)paVar4;
  if (this < paVar4) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
  }
  sVar9._M_str = paVar4 + (long)pbVar5;
  paVar4 = this + (long)pbVar5;
  paVar6 = paVar4;
  if (0 < (long)uVar8 >> 2) {
    paVar6 = sVar9._M_str + ((uint)uVar8 & 3);
    lVar3 = ((long)uVar8 >> 2) + 1;
    do {
      if (((&ascii_internal::kPropertyBits)[(byte)paVar4[-1]] & 8) == 0) goto LAB_00272221;
      if (((&ascii_internal::kPropertyBits)[(byte)paVar4[-2]] & 8) == 0) {
        paVar4 = paVar4 + -1;
        goto LAB_00272221;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)paVar4[-3]] & 8) == 0) {
        paVar4 = paVar4 + -2;
        goto LAB_00272221;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)paVar4[-4]] & 8) == 0) {
        paVar4 = paVar4 + -3;
        goto LAB_00272221;
      }
      paVar4 = paVar4 + -4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)paVar6 - (long)pbVar7;
  if (lVar3 != 1) {
    paVar4 = paVar6;
    if (lVar3 != 2) {
      paVar4 = sVar9._M_str;
      if ((lVar3 != 3) ||
         (paVar4 = paVar6, ((&ascii_internal::kPropertyBits)[(byte)paVar6[-1]] & 8) == 0))
      goto LAB_00272221;
      paVar4 = paVar6 + -1;
    }
    if (((&ascii_internal::kPropertyBits)[(byte)paVar4[-1]] & 8) == 0) goto LAB_00272221;
    paVar6 = paVar4 + -1;
  }
  paVar4 = paVar6;
  if (((&ascii_internal::kPropertyBits)[(byte)paVar6[-1]] & 8) != 0) {
    paVar4 = sVar9._M_str;
  }
LAB_00272221:
  uVar2 = (long)paVar4 - (long)pbVar7;
  if (uVar8 < (ulong)((long)paVar4 - (long)pbVar7)) {
    uVar2 = uVar8;
  }
  sVar9._M_len = uVar2;
  return sVar9;
}

Assistant:

ABSL_MUST_USE_RESULT inline absl::string_view StripAsciiWhitespace(
    absl::string_view str) {
  return StripTrailingAsciiWhitespace(StripLeadingAsciiWhitespace(str));
}